

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_optimizer.c
# Opt level: O0

gravity_function_t * gravity_optimizer(gravity_function_t *f,_Bool add_debug)

{
  ircode_t *code_00;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  inst_t *piVar4;
  bool bVar5;
  inst_t *inst_4;
  uint32_t i_4;
  _Bool b_3;
  inst_t *inst_3;
  uint32_t i_3;
  _Bool b_2;
  inst_t *inst_2;
  uint32_t i_2;
  _Bool b_1;
  inst_t *inst_1;
  uint32_t i_1;
  _Bool b;
  inst_t *inst;
  uint32_t i;
  _Bool optimizer;
  uint32_t count;
  ircode_t *code;
  _Bool add_debug_local;
  gravity_function_t *f_local;
  
  if ((f->field_9).field_0.bytecode == (uint32_t *)0x0) {
    return f;
  }
  code_00 = *(ircode_t **)((long)&f->field_9 + 0x50);
  uVar2 = ircode_count(code_00);
  uVar3 = ircode_ntemps(code_00);
  f->ntemps = (uint16_t)uVar3;
  do {
    inst._4_4_ = 0;
    while( true ) {
      if (uVar2 <= inst._4_4_) {
        do {
          inst_1._0_4_ = 0;
          while( true ) {
            if (uVar2 <= (uint)inst_1) {
              do {
                bVar5 = true;
                inst_2._0_4_ = 0;
                while( true ) {
                  if (uVar2 <= (uint)inst_2) {
                    do {
                      inst_3._0_4_ = 0;
                      while( true ) {
                        if (uVar2 <= (uint)inst_3) {
                          for (inst_4._0_4_ = 0; (uint)inst_4 < uVar2;
                              inst_4._0_4_ = (uint)inst_4 + 1) {
                            piVar4 = current_instruction(code_00,(uint)inst_4);
                            if ((piVar4 != (inst_t *)0x0) && (piVar4->op == LOADI)) {
                              optimize_num_instruction(piVar4,f);
                            }
                          }
                          finalize_function(f,add_debug);
                          return f;
                        }
                        piVar4 = current_instruction(code_00,(uint)inst_3);
                        if (((piVar4 != (inst_t *)0x0) && (piVar4->op == RET)) &&
                           (_Var1 = optimize_return_instruction(code_00,piVar4,(uint)inst_3), _Var1)
                           ) break;
                        inst_3._0_4_ = (uint)inst_3 + 1;
                      }
                    } while( true );
                  }
                  piVar4 = current_instruction(code_00,(uint)inst_2);
                  if ((piVar4 != (inst_t *)0x0) && (piVar4->tag == PRAGMA_MOVE_OPTIMIZATION)) {
                    bVar5 = piVar4->p1 != 0;
                  }
                  if (((bVar5) && (piVar4 != (inst_t *)0x0)) &&
                     ((piVar4->op == MOVE &&
                      (_Var1 = optimize_move_instruction(code_00,piVar4,(uint)inst_2), _Var1))))
                  break;
                  inst_2._0_4_ = (uint)inst_2 + 1;
                }
              } while( true );
            }
            piVar4 = current_instruction(code_00,(uint)inst_1);
            if ((((piVar4 != (inst_t *)0x0) && (SWITCH < piVar4->op)) && (piVar4->op < AND)) &&
               (_Var1 = optimize_math_instruction(code_00,piVar4,(uint)inst_1), _Var1)) break;
            inst_1._0_4_ = (uint)inst_1 + 1;
          }
        } while( true );
      }
      piVar4 = current_instruction(code_00,inst._4_4_);
      if (((piVar4 != (inst_t *)0x0) && (piVar4->op == NEG)) &&
         (_Var1 = optimize_neg_instruction(code_00,piVar4,inst._4_4_), _Var1)) break;
      inst._4_4_ = inst._4_4_ + 1;
    }
  } while( true );
}

Assistant:

gravity_function_t *gravity_optimizer(gravity_function_t *f, bool add_debug) {
    if (f->bytecode == NULL) return f;

    ircode_t    *code = (ircode_t *)f->bytecode;
    uint32_t    count = ircode_count(code);
    bool        optimizer = true;

    f->ntemps = ircode_ntemps(code);

    loop_neg:
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = current_instruction(code, i);
        if (IS_NEG(inst)) {
            bool b = optimize_neg_instruction (code, inst, i);
            if (b) goto loop_neg;
        }
    }

    loop_math:
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = current_instruction(code, i);
        if (IS_MATH(inst)) {
            bool b = optimize_math_instruction (code, inst, i);
            if (b) goto loop_math;
        }
    }

    loop_move:
    optimizer = true;
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = current_instruction(code, i);
        if (IS_PRAGMA_MOVE_OPT(inst)) optimizer = (bool)inst->p1;
        if (optimizer && IS_MOVE(inst)) {
            bool b = optimize_move_instruction (code, inst, i);
            if (b) goto loop_move;
        }
    }

    loop_ret:
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = current_instruction(code, i);
        if (IS_RET(inst)) {
            bool b = optimize_return_instruction (code, inst, i);
            if (b) goto loop_ret;
        }
    }

    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = current_instruction(code, i);
        if (IS_NUM(inst)) optimize_num_instruction (inst, f);
    }

    // dump optimized version
    #if GRAVITY_BYTECODE_DEBUG
    gravity_function_dump(f, ircode_dump);
    #endif

    // finalize function
	finalize_function(f, add_debug);

    return f;
}